

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dtypes.h
# Opt level: O0

void __thiscall GroupInfo::GroupInfo(GroupInfo *this)

{
  GroupInfo *this_local;
  
  this->name_length = -1;
  this->id = -1;
  this->name = (char *)0x0;
  this->next_offset = -1;
  this->descr_length = -1;
  this->description = (char *)0x0;
  this->locked = false;
  return;
}

Assistant:

GroupInfo() :
		name_length(-1),
		id(-1),
		name(NULL),
		next_offset(-1),
		descr_length(-1),
		description(NULL),
		locked(false)
	{}